

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.cpp
# Opt level: O1

void hmac_hash::sha1(void *data,size_t length,uint8_t *digest)

{
  SHA1 ctx;
  SHA1 local_40;
  
  local_40.m_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_40.m_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40.m_h[0] = 0x67452301;
  local_40.m_h[1] = 0xefcdab89;
  local_40.m_h[2] = 0x98badcfe;
  local_40.m_h[3] = 0x10325476;
  local_40.m_h[4] = 0xc3d2e1f0;
  local_40.m_transforms = 0;
  local_40.m_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  SHA1::update(&local_40,(uchar *)data,length);
  SHA1::finish(&local_40,digest);
  if (local_40.m_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.m_buffer.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void sha1(const void* data, size_t length, uint8_t* digest) {
        hmac_hash::SHA1 ctx;
        ctx.init();
        ctx.update(reinterpret_cast<const uint8_t*>(data), length);
        ctx.finish(digest);
    }